

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_vacuum.cpp
# Opt level: O1

void pstore::start_vacuum(database *db)

{
  UI_STRING *extraout_RDX;
  UI_STRING *extraout_RDX_00;
  UI_STRING *uis;
  UI *ui;
  writer wr;
  fifo_path fifo;
  long *local_128 [2];
  long local_118 [2];
  code *local_108;
  undefined8 uStack_100;
  code *local_f8;
  code *pcStack_f0;
  update_callback local_e8;
  writer local_c8;
  fifo_path local_88;
  
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_functor._M_unused._M_object =
       brokerface::fifo_path::default_update_cb;
  local_e8._M_invoker =
       std::
       _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
       ::_M_invoke;
  local_e8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
       ::_M_manager;
  brokerface::fifo_path::fifo_path(&local_88,(czstring)0x0,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  uStack_100 = 0;
  local_108 = brokerface::writer::default_callback;
  pcStack_f0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_f8 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  brokerface::writer::writer(&local_c8,(UI *)&local_88,(UI_STRING *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  (*((db->storage_).file_.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_file_base[5])(local_128);
  ui = (UI *)0x0;
  brokerface::send_message(&local_c8,false,"GC",(czstring)local_128[0]);
  uis = extraout_RDX;
  if (local_128[0] != local_118) {
    ui = (UI *)(local_118[0] + 1);
    operator_delete(local_128[0],(ulong)ui);
    uis = extraout_RDX_00;
  }
  brokerface::writer::~writer(&local_c8,ui,uis);
  brokerface::fifo_path::~fifo_path(&local_88);
  return;
}

Assistant:

void start_vacuum (database const & db) {
        brokerface::fifo_path const fifo (nullptr);
        brokerface::writer wr (fifo);
        brokerface::send_message (wr, false /*error on timeout*/, "GC", db.path ().c_str ());
    }